

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

apx_error_t
apx_server_add_extension
          (apx_server_t *self,char *name,apx_serverExtensionHandler_t *handler,dtl_dv_t *config)

{
  apx_serverExtension_t *pItem;
  apx_error_t aVar1;
  
  aVar1 = 1;
  if (handler != (apx_serverExtensionHandler_t *)0x0 && self != (apx_server_t *)0x0) {
    pItem = apx_serverExtension_new(name,handler,config);
    if (pItem == (apx_serverExtension_t *)0x0) {
      aVar1 = 2;
    }
    else {
      adt_list_insert(&self->extension_manager,pItem);
      aVar1 = 0;
      if (config != (dtl_dv_t *)0x0) {
        dtl_dv_inc_ref(config);
        aVar1 = 0;
      }
    }
  }
  return aVar1;
}

Assistant:

apx_error_t apx_server_add_extension(apx_server_t* self, const char* name, apx_serverExtensionHandler_t* handler, dtl_dv_t* config)
{
   if ( (self != NULL) && (handler != 0) )
   {
      apx_serverExtension_t *extension = apx_serverExtension_new(name, handler, config);
      if (extension == 0)
      {
         return APX_MEM_ERROR;
      }
      adt_list_insert(&self->extension_manager, (void*) extension);
      if (config != 0)
      {
         dtl_dv_inc_ref(config);
      }
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}